

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helper.cpp
# Opt level: O0

bool SHOPManagement::Helper::saveFileByLine
               (string *file_path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *t_data)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  reference pbVar4;
  string local_260 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> line;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ostream local_218 [8];
  ofstream file_data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *t_data_local;
  string *file_path_local;
  
  std::ofstream::ofstream(local_218,(string *)file_path,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)file_path);
    std::operator<<(poVar3," can\'t open!");
    exit(1);
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(t_data);
  line.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(t_data);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&line.field_2 + 8));
    if (!bVar2) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_260,(string *)pbVar4);
    std::operator<<(local_218,local_260);
    std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_260);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::ofstream::close();
  bVar1 = std::ios::good();
  std::ofstream::~ofstream(local_218);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Helper::saveFileByLine(const std::string &file_path, const std::vector<std::string> &t_data)
    {
        std::ofstream file_data(file_path);

        if (!file_data.is_open())
        {
            std::cerr << file_path << " can't open!";
            exit(EXIT_FAILURE);
        }

        for (auto line : t_data)
        {
            file_data << line;
            file_data << std::endl;
        }

        file_data.close();
        return file_data.good();
    }